

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
StrEqualNode::Evaluate
          (string *__return_storage_ptr__,StrEqualNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *param_2,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  size_t __n;
  int iVar2;
  char *pcVar3;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = pbVar1->_M_string_length;
  if (__n == pbVar1[1]._M_string_length) {
    if (__n == 0) {
      pcVar3 = "1";
    }
    else {
      iVar2 = bcmp((pbVar1->_M_dataplus)._M_p,pbVar1[1]._M_dataplus._M_p,__n);
      pcVar3 = "0";
      if (iVar2 == 0) {
        pcVar3 = "1";
      }
    }
  }
  else {
    pcVar3 = "0";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string>& parameters,
                       cmGeneratorExpressionContext* /*context*/,
                       const GeneratorExpressionContent* /*content*/,
                       cmGeneratorExpressionDAGChecker* /*dagChecker*/) const
    CM_OVERRIDE
  {
    return *parameters.begin() == parameters[1] ? "1" : "0";
  }